

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_adf.cc
# Opt level: O0

void CB_ADF::do_actual_learning<true>(cb_adf *data,multi_learner *base,multi_ex *ec_seq)

{
  cb_adf *mydata;
  bool bVar1;
  reference ppeVar2;
  ostream *this;
  undefined8 uVar3;
  vector<example_*,_std::allocator<example_*>_> *in_RDX;
  long in_RDI;
  cb_class cVar4;
  stringstream __msg;
  multi_ex *in_stack_00000198;
  multi_ex *in_stack_fffffffffffffe00;
  multi_learner *in_stack_fffffffffffffe08;
  undefined7 in_stack_fffffffffffffe18;
  undefined1 in_stack_fffffffffffffe1f;
  undefined1 uVar5;
  undefined4 in_stack_fffffffffffffe20;
  int in_stack_fffffffffffffe24;
  char *in_stack_fffffffffffffe28;
  vw_exception *in_stack_fffffffffffffe30;
  multi_ex *in_stack_fffffffffffffe40;
  multi_learner *in_stack_fffffffffffffe48;
  cb_adf *in_stack_fffffffffffffe50;
  multi_ex *in_stack_fffffffffffffe60;
  uint64_t in_stack_fffffffffffffe68;
  v_array<COST_SENSITIVE::label> *in_stack_fffffffffffffe70;
  label *in_stack_fffffffffffffe78;
  v_array<CB::label> *in_stack_fffffffffffffe80;
  multi_ex *in_stack_fffffffffffffe88;
  multi_learner *in_stack_fffffffffffffe90;
  size_t in_stack_fffffffffffffea0;
  multi_ex *in_stack_ffffffffffffff50;
  multi_learner *in_stack_ffffffffffffff58;
  cb_adf *in_stack_ffffffffffffff60;
  undefined8 local_28;
  undefined8 local_20;
  
  ppeVar2 = std::vector<example_*,_std::allocator<example_*>_>::operator[](in_RDX,0);
  *(uint64_t *)(in_RDI + 0x158) = ((*ppeVar2)->super_example_predict).ft_offset;
  cVar4 = get_observed_cost(in_stack_fffffffffffffe60);
  local_28 = cVar4._0_8_;
  *(undefined8 *)(in_RDI + 0x60) = local_28;
  local_20 = cVar4._8_8_;
  *(undefined8 *)(in_RDI + 0x68) = local_20;
  bVar1 = test_adf_sequence(in_stack_00000198);
  if (bVar1) {
    GEN_CS::gen_cs_test_example
              ((multi_ex *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
               (label *)CONCAT17(in_stack_fffffffffffffe1f,in_stack_fffffffffffffe18));
    GEN_CS::call_cs_ldf<false>
              (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,
               in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,
               in_stack_fffffffffffffea0);
  }
  else {
    mydata = *(cb_adf **)(in_RDI + 8);
    switch(mydata) {
    case (cb_adf *)0x0:
      learn_DR(mydata,in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
      break;
    case (cb_adf *)0x1:
      learn_DM(mydata,in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
      break;
    case (cb_adf *)0x2:
      learn_IPS(mydata,in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
      break;
    case (cb_adf *)0x3:
      if ((*(byte *)(in_RDI + 0x160) & 1) == 0) {
        learn_MTR<true>(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
                        in_stack_fffffffffffffe40);
      }
      else {
        learn_MTR<false>(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
                         in_stack_fffffffffffffe40);
      }
      break;
    case (cb_adf *)0x4:
      learn_SM(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
      break;
    default:
      std::__cxx11::stringstream::stringstream((stringstream *)&stack0xfffffffffffffe50);
      this = std::operator<<((ostream *)&stack0xfffffffffffffe60,
                             "Unknown cb_type specified for contextual bandit learning: ");
      std::ostream::operator<<(this,*(ulong *)(in_RDI + 8));
      uVar5 = 1;
      uVar3 = __cxa_allocate_exception(0x38);
      std::__cxx11::stringstream::str();
      VW::vw_exception::vw_exception
                (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,in_stack_fffffffffffffe24,
                 (string *)CONCAT17(uVar5,in_stack_fffffffffffffe18));
      __cxa_throw(uVar3,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
  }
  return;
}

Assistant:

void do_actual_learning(cb_adf& data, multi_learner& base, multi_ex& ec_seq)
{
  data.offset = ec_seq[0]->ft_offset;
  data.gen_cs.known_cost = get_observed_cost(ec_seq);  // need to set for test case
  if (is_learn && !test_adf_sequence(ec_seq))
  {
    /*	v_array<float> temp_scores;
    temp_scores = v_init<float>();
    do_actual_learning<false>(data,base);
    for (size_t i = 0; i < data.ec_seq[0]->pred.a_s.size(); i++)
    temp_scores.push_back(data.ec_seq[0]->pred.a_s[i].score);*/
    switch (data.gen_cs.cb_type)
    {
      case CB_TYPE_IPS:
        learn_IPS(data, base, ec_seq);
        break;
      case CB_TYPE_DR:
        learn_DR(data, base, ec_seq);
        break;
      case CB_TYPE_DM:
        learn_DM(data, base, ec_seq);
        break;
      case CB_TYPE_MTR:
        if (data.no_predict)
          learn_MTR<false>(data, base, ec_seq);
        else
          learn_MTR<true>(data, base, ec_seq);
        break;
      case CB_TYPE_SM:
        learn_SM(data, base, ec_seq);
        break;
      default:
        THROW("Unknown cb_type specified for contextual bandit learning: " << data.gen_cs.cb_type);
    }

    /*      for (size_t i = 0; i < temp_scores.size(); i++)
    if (temp_scores[i] != data.ec_seq[0]->pred.a_s[i].score)
      cout << "problem! " << temp_scores[i] << " != " << data.ec_seq[0]->pred.a_s[i].score << " for " <<
    data.ec_seq[0]->pred.a_s[i].action << endl; temp_scores.delete_v();*/
  }
  else
  {
    gen_cs_test_example(ec_seq, data.cs_labels);  // create test labels.
    call_cs_ldf<false>(base, ec_seq, data.cb_labels, data.cs_labels, data.prepped_cs_labels, data.offset);
  }
}